

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O2

bool __thiscall
EnrichableAnalyzerSubprocess::GetScriptResponse
          (EnrichableAnalyzerSubprocess *this,char *outBuffer,uint outBufferLength,char *inBuffer,
          uint inBufferLength)

{
  bool bVar1;
  
  std::mutex::lock(&subprocessLock);
  SendOutputLine(this,outBuffer,outBufferLength);
  bVar1 = GetInputLine(this,inBuffer,inBufferLength);
  pthread_mutex_unlock((pthread_mutex_t *)&subprocessLock);
  return bVar1;
}

Assistant:

bool EnrichableAnalyzerSubprocess::GetScriptResponse(
	const char* outBuffer,
	unsigned outBufferLength,
	char* inBuffer,
	unsigned inBufferLength
) {
	bool result;

	LockSubprocess();
	SendOutputLine(outBuffer, outBufferLength);
	result = GetInputLine(inBuffer, inBufferLength);
	UnlockSubprocess();

	return result;
}